

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::tracker_list::replace
          (tracker_list *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *aes)

{
  header_holder_type *this_node;
  trackers_t *this_00;
  byte *pbVar1;
  undefined8 *puVar2;
  node_ptr plVar3;
  pointer paVar4;
  node_ptr plVar5;
  node_ptr plVar6;
  size_type sVar7;
  unsigned_long uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  node_ptr to_erase;
  element_type *this_01;
  node_ptr plVar11;
  size_t i_1;
  long lVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
  *plVar18;
  announce_entry *ae;
  pointer a0;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_false,_true>,_bool>
  pVar19;
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  carry;
  size_type local_658;
  undefined1 auStack_650 [16];
  tracker_list *local_640;
  size_type local_638;
  list_node<void_*> alStack_630 [95];
  undefined8 local_38;
  
  this_node = &(this->m_trackers).super_type.data_.root_plus_size_.m_header;
  plVar6 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar6 != &this_node->super_node) {
    plVar3 = plVar6->next_;
    plVar6->next_ = (node_ptr)0x0;
    plVar6->prev_ = (node_ptr)0x0;
    plVar6 = plVar3;
  }
  this_00 = &this->m_trackers;
  (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_ =
       &this_node->super_node;
  (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       &this_node->super_node;
  (this->m_trackers).super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
  ::std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->m_url_index)._M_h);
  boost::object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
  ~object_pool(&this->m_storage);
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.list.sz = 0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.list.ptr = (char *)0x0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.requested_size = 0x70;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.next_size = 0x20;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.start_size = 0x20;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.max_size = 0;
  paVar4 = (aes->
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (a0 = (aes->
            super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            )._M_impl.super__Vector_impl_data._M_start; a0 != paVar4; a0 = a0 + 1) {
    if ((a0->url)._M_string_length != 0) {
      this_01 = boost::
                object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>
                ::construct<libtorrent::v1_2::announce_entry>(&this->m_storage,a0);
      alStack_630[0].next_ = (node_ptr)(this_01->url)._M_dataplus._M_p;
      local_638 = (this_01->url)._M_string_length;
      alStack_630[0].prev_ = (node_ptr)this_01;
      pVar19 = ::std::
               _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*>>
                         ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->m_url_index,&local_638);
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        announce_entry::~announce_entry(this_01);
        boost::simple_segregated_storage<unsigned_long>::ordered_free
                  ((simple_segregated_storage<unsigned_long> *)this,this_01);
        pbVar1 = (byte *)(*(long *)((long)pVar19.first.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
                                          ._M_cur.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
                                   + 0x18) + 0x6e);
        *pbVar1 = *pbVar1 | a0->field_0x5a & 0xf;
      }
      else {
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
        ::push_back(&this_00->super_type,this_01);
      }
    }
  }
  plVar11 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar11 != (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.prev_) {
    local_658 = 0;
    auStack_650._0_8_ = (node_ptr)auStack_650;
    auStack_650._8_8_ = (node_ptr)auStack_650;
    lVar12 = 0;
    do {
      lVar15 = (long)&alStack_630[0].next_ + lVar12;
      *(undefined8 *)((long)&local_638 + lVar12) = 0;
      *(undefined8 *)((long)&alStack_630[0].next_ + lVar12) = 0;
      *(long *)lVar15 = lVar15;
      *(long *)((long)&alStack_630[0].prev_ + lVar12) = lVar15;
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x600);
    uVar13 = 0;
    local_640 = this;
    if (plVar11 != &this_node->super_node && plVar11 != (node_ptr)0x0) {
      uVar13 = 0;
      do {
        plVar5 = plVar11->next_;
        if (plVar11 != (node_ptr)auStack_650._0_8_ && plVar5 != (node_ptr)auStack_650._0_8_) {
          plVar6 = *(node_ptr *)(auStack_650._0_8_ + 8);
          plVar3 = plVar11->prev_;
          plVar6->next_ = plVar11;
          plVar11->prev_ = plVar6;
          plVar11->next_ = (node_ptr)auStack_650._0_8_;
          *(node_ptr *)(auStack_650._0_8_ + 8) = plVar11;
          plVar5->prev_ = plVar3;
          plVar3->next_ = plVar5;
        }
        (this_00->super_type).data_.root_plus_size_.super_size_traits.size_ =
             (this_00->super_type).data_.root_plus_size_.super_size_traits.size_ - 1;
        if (uVar13 == 0) {
          uVar17 = 0;
          local_658 = local_658 + 1;
        }
        else {
          plVar18 = (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
                     *)&local_638;
          uVar16 = 0;
          local_658 = local_658 + 1;
          do {
            uVar17 = uVar16;
            if ((*(node_ptr *)(plVar18 + 8) == (node_ptr)0x0) ||
               ((node_ptr)(plVar18 + 8) == *(node_ptr *)(plVar18 + 8))) break;
            boost::intrusive::
            list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
            ::
            merge<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
                      (plVar18,&local_658);
            boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>
            ::swap_nodes((node_ptr)auStack_650,(node_ptr)(plVar18 + 8));
            uVar16 = uVar16 + 1;
            sVar7 = *(size_type *)plVar18;
            *(size_type *)plVar18 = local_658;
            plVar18 = plVar18 + 0x18;
            uVar17 = uVar13;
            local_658 = sVar7;
          } while (uVar13 != uVar16);
        }
        boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
        swap_nodes((node_ptr)auStack_650,
                   (node_ptr)((long)alStack_630 + (uVar17 & 0xffffffff) * 0x18));
        sVar7 = (&local_638)[(uVar17 & 0xffffffff) * 3];
        (&local_638)[(uVar17 & 0xffffffff) * 3] = local_658;
        uVar13 = (ulong)((uint)((int)uVar17 == (int)uVar13) + (int)uVar13);
        plVar11 = (this_node->super_node).next_;
        local_658 = sVar7;
      } while ((plVar11 != (node_ptr)0x0) && (plVar11 != &this_node->super_node));
    }
    if (1 < (uint)uVar13) {
      lVar12 = uVar13 - 1;
      plVar18 = (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
                 *)&local_638;
      do {
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
        ::
        merge<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
                  (plVar18 + 0x18,plVar18);
        lVar12 = lVar12 + -1;
        plVar18 = plVar18 + 0x18;
      } while (lVar12 != 0);
    }
    boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
    swap_nodes(&this_node->super_node,(node_ptr)(auStack_650 + uVar13 * 0x18 + 8));
    uVar8 = (this_00->super_type).data_.root_plus_size_.super_size_traits.size_;
    (this_00->super_type).data_.root_plus_size_.super_size_traits.size_ =
         *(unsigned_long *)(auStack_650 + uVar13 * 0x18);
    *(unsigned_long *)(auStack_650 + uVar13 * 0x18) = uVar8;
    lVar12 = 0;
    puVar14 = &local_38;
    do {
      puVar2 = puVar14 + -2;
      puVar10 = (undefined8 *)puVar14[-2];
      while (puVar10 != puVar2) {
        puVar9 = (undefined8 *)*puVar10;
        *puVar10 = 0;
        puVar10[1] = 0;
        puVar10 = puVar9;
      }
      puVar14[-2] = puVar2;
      puVar14[-1] = puVar2;
      puVar14[-3] = 0;
      puVar14[-2] = 0;
      puVar14[-1] = 0;
      lVar12 = lVar12 + 1;
      puVar14 = puVar14 + -3;
    } while (lVar12 != 0x40);
    while (this = local_640, (node_ptr)auStack_650._0_8_ != (node_ptr)auStack_650) {
      plVar6 = ((node_ptr)auStack_650._0_8_)->next_;
      ((node_ptr)auStack_650._0_8_)->next_ = (node_ptr)0x0;
      ((node_ptr)auStack_650._0_8_)->prev_ = (node_ptr)0x0;
      auStack_650._0_8_ = plVar6;
    }
  }
  this->m_last_working_tracker = (announce_entry *)0x0;
  return;
}

Assistant:

void tracker_list::replace(std::vector<lt::announce_entry> const& aes)
{
	INVARIANT_CHECK;

	m_trackers.clear();
	m_url_index.clear();

	m_storage.~object_pool<aux::announce_entry>();
	new (&m_storage) boost::object_pool<aux::announce_entry>();

	for (auto const& ae : aes)
	{
		if (ae.url.empty()) continue;
		aux::announce_entry* new_ae = m_storage.construct(ae);
		auto const [iter, added] = m_url_index.insert(std::make_pair(string_view(new_ae->url), new_ae));
		if (!added)
		{
			// if we already have an entry with this URL, skip it
			// but merge the source bits
			m_storage.destroy(new_ae);
			iter->second->source |= ae.source;
			continue;
		}
		m_trackers.push_back(*new_ae);
	}

	// make sure the trackers are correctly ordered by tier
	m_trackers.sort([](aux::announce_entry const& lhs, aux::announce_entry const& rhs)
	{ return lhs.tier < rhs.tier; });

	m_last_working_tracker = nullptr;
}